

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>
          (rule *this,transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args,
          string_mapping *args_1)

{
  context *pcVar1;
  error_code eVar2;
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
  local_40;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_38;
  string_mapping *local_30;
  string_mapping *args_local_1;
  transaction<pstore::lock_guard<pstore::transaction_mutex>_> *args_local;
  rule *this_local;
  error_category *local_10;
  
  local_30 = args_1;
  args_local_1 = (string_mapping *)args;
  args_local = (transaction<pstore::lock_guard<pstore::transaction_mutex>_> *)this;
  pcVar1 = gsl::not_null<pstore::exchange::import_ns::context_*>::operator->(&this->context_);
  std::
  make_unique<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*&,pstore::exchange::import_ns::string_mapping*&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_40,
             (transaction<pstore::lock_guard<pstore::transaction_mutex>_> **)&this->context_,
             &args_local_1);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>,std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>>*,pstore::exchange::import_ns::string_mapping*>>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_38,&local_40);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(&pcVar1->stack,(value_type *)&local_38);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_38);
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilations_index,_pstore::transaction<pstore::lock_guard<pstore::transaction_mutex>_>_*,_pstore::exchange::import_ns::string_mapping_*>_>_>
  ::~unique_ptr(&local_40);
  log_top(this,true);
  std::error_code::error_code((error_code *)&this_local);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)this_local;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }